

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sais.c
# Opt level: O1

int sais_main(void *T,int *SA,int *LCP,int fs,int n,int k,int cs,int isbwt,int level0)

{
  size_t sVar1;
  bool bVar2;
  long lVar3;
  int i;
  uint *__s;
  uint *__ptr;
  uint *puVar4;
  ulong uVar5;
  long lVar6;
  int *piVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  long lVar12;
  int *piVar13;
  ulong uVar14;
  void *pvVar15;
  int *piVar16;
  int iVar17;
  ulong uVar18;
  ulong uVar19;
  int iVar20;
  ulong uVar21;
  byte bVar22;
  uint uVar23;
  uint uVar24;
  uint *puVar25;
  long lVar26;
  void *pvVar27;
  ulong uVar28;
  ulong uVar29;
  long lVar30;
  uint uVar31;
  int iVar32;
  uint uVar34;
  int iVar35;
  uint uVar36;
  uint uVar37;
  undefined4 uVar38;
  long lVar39;
  bool bVar40;
  ulong local_e8;
  int t;
  void *local_80;
  size_t local_78;
  ulong local_70;
  uint local_64;
  ulong local_60;
  ulong local_58;
  void *local_50;
  void *local_48;
  size_t local_40;
  ulong local_38;
  ulong uVar33;
  
  if (T == (void *)0x0) {
    __assert_fail("(T != NULL) && (SA != NULL)",
                  "/workspace/llm4binary/github/license_c_cmakelists/jeffdaily[P]parasail/contrib/sais-lite-lcp/sais.c"
                  ,0x236,"int sais_main(const void *, int *, int *, int, int, int, int, int, int)");
  }
  if (((fs < 0) || (n < 1)) || (uVar21 = (ulong)(uint)k, k < 1)) {
    __assert_fail("(0 <= fs) && (0 < n) && (1 <= k)",
                  "/workspace/llm4binary/github/license_c_cmakelists/jeffdaily[P]parasail/contrib/sais-lite-lcp/sais.c"
                  ,0x237,"int sais_main(const void *, int *, int *, int, int, int, int, int, int)");
  }
  if (k < 0x101) {
    __s = (uint *)malloc(uVar21 << 2);
    if (__s == (uint *)0x0) {
      return -2;
    }
    if (k <= fs) {
      bVar22 = 1;
      bVar40 = false;
      __ptr = (uint *)(SA + ((n + fs) - k));
      goto LAB_0010e744;
    }
    __ptr = (uint *)malloc(uVar21 << 2);
    if (__ptr == (uint *)0x0) {
      iVar20 = -2;
      goto LAB_00110d61;
    }
    bVar22 = 3;
LAB_0010e6aa:
    bVar40 = false;
  }
  else {
    if (fs < k) {
      __s = (uint *)malloc(uVar21 << 2);
      if (__s == (uint *)0x0) {
        return -2;
      }
      bVar22 = 0xc;
      __ptr = __s;
      goto LAB_0010e6aa;
    }
    __s = (uint *)(SA + ((n + fs) - k));
    if (fs - k < k) {
      if (k < 0x401) {
        __ptr = (uint *)malloc(uVar21 << 2);
        if (__ptr == (uint *)0x0) {
          return -2;
        }
        bVar22 = 2;
        goto LAB_0010e6aa;
      }
      bVar22 = 8;
      bVar40 = false;
      __ptr = __s;
    }
    else {
      __ptr = __s + -uVar21;
      bVar22 = 0;
      bVar40 = true;
    }
  }
LAB_0010e744:
  if ((n < 0x40000000) && (1 < (int)((uint)n / (uint)k))) {
    if ((bVar22 & 1) == 0) {
      if (bVar40) {
        bVar22 = (k * 2 <= fs + k * -2) << 5;
      }
    }
    else {
      bVar22 = bVar22 + (k * 2 <= fs - k) * '\x10' + 0x10;
    }
  }
  uVar18 = 0;
  local_60 = uVar21;
  memset(__s,0,uVar21 * 4);
  uVar5 = (ulong)(uint)n;
  do {
    if (cs == 4) {
      uVar8 = *(uint *)((long)T + uVar18 * 4);
    }
    else {
      uVar8 = (uint)*(byte *)((long)T + uVar18);
    }
    __s[(int)uVar8] = __s[(int)uVar8] + 1;
    uVar18 = uVar18 + 1;
  } while (uVar5 != uVar18);
  uVar18 = 0;
  uVar8 = 0;
  do {
    uVar8 = uVar8 + __s[uVar18];
    __ptr[uVar18] = uVar8;
    uVar18 = uVar18 + 1;
  } while (uVar21 != uVar18);
  if (0 < n) {
    memset(SA,0,uVar5 * 4);
  }
  uVar8 = n - 1;
  uVar18 = (ulong)uVar8;
  if (cs == 4) {
    uVar24 = *(uint *)((long)T + uVar18 * 4);
  }
  else {
    uVar24 = (uint)*(byte *)((long)T + uVar18);
  }
  uVar19 = (ulong)uVar8;
  uVar36 = (int)uVar8 >> 0x1f & uVar8;
  local_80 = (void *)(ulong)uVar36;
  uVar34 = uVar36 - 1;
  uVar14 = uVar19;
  uVar23 = n;
  do {
    uVar11 = uVar23;
    uVar14 = uVar14 - 1;
    uVar23 = uVar11 - 1;
    uVar31 = uVar34;
    if ((int)uVar23 < 1) goto LAB_0010e897;
    if (cs == 4) {
      uVar31 = *(uint *)((long)T + (uVar14 & 0xffffffff) * 4);
    }
    else {
      uVar31 = (uint)*(byte *)((long)T + (uVar14 & 0xffffffff));
    }
    bVar40 = (int)uVar24 <= (int)uVar31;
    uVar24 = uVar31;
  } while (bVar40);
  uVar31 = uVar11 - 2;
  uVar36 = uVar23;
LAB_0010e897:
  if ((int)uVar36 < 1) {
    local_e8 = 0;
    piVar7 = &t;
    uVar14 = (ulong)(uint)n;
  }
  else {
    piVar7 = &t;
    local_e8 = 0;
    uVar14 = (ulong)(uint)n;
    do {
      uVar28 = (ulong)uVar31;
      uVar29 = (ulong)uVar31;
      do {
        uVar36 = uVar24;
        uVar28 = uVar28 - 1;
        iVar20 = (int)uVar29;
        uVar29 = (ulong)(((int)uVar31 >> 0x1f & uVar31) - 1);
        uVar24 = uVar36;
        if (iVar20 < 1) break;
        if (cs == 4) {
          uVar24 = *(uint *)((long)T + (uVar28 & 0xffffffff) * 4);
        }
        else {
          uVar24 = (uint)*(byte *)((long)T + (uVar28 & 0xffffffff));
        }
        uVar29 = (ulong)(iVar20 - 1);
      } while ((int)uVar24 <= (int)uVar36);
      uVar31 = 0xffffffff;
      if (0 < iVar20) {
        *piVar7 = (int)uVar14;
        uVar23 = __ptr[(int)uVar36];
        __ptr[(int)uVar36] = uVar23 - 1;
        piVar7 = SA + (long)(int)uVar23 + -1;
        local_e8 = (ulong)((int)local_e8 + 1);
        uVar33 = uVar29;
        uVar36 = uVar24;
        uVar28 = uVar29;
        do {
          uVar28 = uVar28 - 1;
          uVar14 = uVar29;
          uVar24 = uVar36;
          uVar31 = 0xffffffff;
          if ((int)uVar33 < 1) break;
          if (cs == 4) {
            uVar24 = *(uint *)((long)T + (uVar28 & 0xffffffff) * 4);
          }
          else {
            uVar24 = (uint)*(byte *)((long)T + (uVar28 & 0xffffffff));
          }
          uVar31 = (int)uVar33 - 1;
          uVar33 = (ulong)uVar31;
          bVar40 = (int)uVar36 <= (int)uVar24;
          uVar36 = uVar24;
        } while (bVar40);
      }
    } while (-1 < (int)uVar31);
  }
  uVar24 = (uint)local_e8;
  if ((int)uVar24 < 2) {
    iVar20 = 0;
    if (uVar24 == 1) {
      *piVar7 = (int)uVar14 + 1;
      iVar20 = 1;
      if (level0 != 0) {
        *(undefined4 *)((long)LCP + ((long)piVar7 - (long)SA)) = 0xffffffff;
      }
    }
LAB_0010f451:
    if ((int)uVar24 <= iVar20) {
      if (1 < (int)uVar24 && level0 != 0) {
        uVar18 = 1;
        piVar7 = SA;
        do {
          iVar20 = -1;
          pvVar15 = T;
          pvVar27 = T;
          do {
            if (cs == 4) {
              uVar34 = *(uint *)((long)pvVar27 + (long)SA[uVar18] * 4);
              uVar36 = *(uint *)((long)pvVar27 + (long)*piVar7 * 4);
            }
            else {
              uVar34 = (uint)*(byte *)((long)pvVar15 + (long)SA[uVar18]);
              uVar36 = (uint)*(byte *)((long)pvVar15 + (long)*piVar7);
            }
            iVar20 = iVar20 + 1;
            pvVar27 = (void *)((long)pvVar27 + 4);
            pvVar15 = (void *)((long)pvVar15 + 1);
          } while (uVar34 == uVar36);
          LCP[uVar18] = iVar20;
          piVar7 = SA + uVar18;
          uVar18 = uVar18 + 1;
        } while (uVar18 != local_e8);
      }
LAB_0010f53c:
      if ((bVar22 & 8) != 0) {
        uVar18 = 0;
        memset(__s,0,uVar21 * 4);
        do {
          if (cs == 4) {
            uVar34 = *(uint *)((long)T + uVar18 * 4);
          }
          else {
            uVar34 = (uint)*(byte *)((long)T + uVar18);
          }
          __s[(int)uVar34] = __s[(int)uVar34] + 1;
          uVar18 = uVar18 + 1;
        } while (uVar5 != uVar18);
      }
      if (1 < (int)uVar24) {
        uVar18 = 0;
        uVar34 = 0;
        do {
          uVar34 = uVar34 + __s[uVar18];
          __ptr[uVar18] = uVar34;
          uVar18 = uVar18 + 1;
        } while (uVar21 != uVar18);
        uVar18 = (ulong)(uVar24 - 1);
        iVar20 = SA[uVar18];
        if (cs == 4) {
          uVar24 = *(uint *)((long)T + (long)iVar20 * 4);
        }
        else {
          uVar24 = (uint)*(byte *)((long)T + (long)iVar20);
        }
        if (level0 == 0) {
          uVar14 = (ulong)(uint)n;
          do {
            uVar36 = (uint)uVar18;
            uVar34 = __ptr[(int)uVar24];
            iVar9 = (int)uVar14;
            if ((int)uVar34 < iVar9) {
              lVar39 = (long)iVar9;
              memset(SA + (lVar39 - (ulong)(~uVar34 + iVar9)) + -1,0,
                     (ulong)(~uVar34 + iVar9) * 4 + 4);
              do {
                lVar39 = lVar39 + -1;
              } while ((int)uVar34 < lVar39);
              iVar9 = (int)lVar39;
            }
            uVar14 = (ulong)(iVar9 - 1);
            SA[(long)iVar9 + -1] = iVar20;
            uVar18 = (ulong)(uVar36 - 1);
            if ((int)uVar36 < 1) {
              bVar40 = false;
              uVar34 = uVar24;
            }
            else {
              piVar7 = SA + (long)iVar9 + -2;
              uVar18 = (ulong)(uVar36 - 1);
              do {
                iVar20 = SA[uVar18];
                if (cs == 4) {
                  uVar34 = *(uint *)((long)T + (long)iVar20 * 4);
                }
                else {
                  uVar34 = (uint)*(byte *)((long)T + (long)iVar20);
                }
                bVar40 = uVar34 != uVar24;
                if (bVar40) goto LAB_0010f7fe;
                *piVar7 = iVar20;
                uVar14 = (ulong)((int)uVar14 - 1);
                piVar7 = piVar7 + -1;
                bVar2 = 0 < (long)uVar18;
                uVar18 = uVar18 - 1;
              } while (bVar2);
              uVar18 = 0xffffffff;
              uVar14 = (ulong)(~uVar36 + iVar9);
            }
LAB_0010f7fe:
            uVar24 = uVar34;
            uVar18 = uVar18 & 0xffffffff;
          } while (bVar40);
          if (0 < (int)uVar14) {
            memset(SA,0,uVar14 << 2);
          }
        }
        else {
          iVar9 = LCP[uVar18];
          uVar14 = (ulong)(uint)n;
          do {
            uVar34 = __ptr[(int)uVar24];
            if ((int)uVar34 < (int)uVar14) {
              uVar14 = (ulong)(int)uVar14;
              do {
                SA[uVar14 - 1] = 0;
                LCP[uVar14 - 1] = -2;
                uVar14 = uVar14 - 1;
              } while ((long)(int)uVar34 < (long)uVar14);
            }
            iVar17 = (int)uVar14;
            lVar39 = (long)iVar17;
            uVar29 = lVar39 - 1;
            SA[lVar39 + -1] = iVar20;
            LCP[lVar39 + -1] = iVar9;
            uVar34 = (uint)uVar18;
            uVar36 = uVar34 - 1;
            if ((int)uVar34 < 1) {
              uVar14 = (ulong)(iVar17 - 1);
              bVar40 = false;
            }
            else {
              uVar18 = (ulong)uVar36;
              uVar14 = (ulong)(iVar17 + ~uVar34);
              lVar6 = 0;
              do {
                iVar20 = SA[uVar18 + lVar6];
                if (cs == 4) {
                  uVar34 = *(uint *)((long)T + (long)iVar20 * 4);
                }
                else {
                  uVar34 = (uint)*(byte *)((long)T + (long)iVar20);
                }
                iVar9 = LCP[uVar18 + lVar6];
                bVar40 = uVar34 != uVar24;
                if (bVar40) {
                  uVar36 = uVar36 + (int)lVar6;
                  uVar29 = uVar29 + lVar6;
                  uVar14 = uVar29 & 0xffffffff;
                  uVar24 = uVar34;
                  goto LAB_0010f6d7;
                }
                SA[lVar39 + lVar6 + -2] = iVar20;
                LCP[lVar39 + lVar6 + -2] = iVar9;
                lVar26 = uVar18 + lVar6;
                lVar6 = lVar6 + -1;
              } while (0 < lVar26);
              uVar29 = uVar29 + lVar6;
              uVar36 = 0xffffffff;
              uVar24 = uVar34;
            }
LAB_0010f6d7:
            LCP[uVar29] = -1;
            uVar18 = (ulong)uVar36;
          } while (bVar40);
          if (0 < (int)uVar14) {
            lVar39 = uVar14 + 1;
            do {
              SA[lVar39 + -2] = 0;
              LCP[lVar39 + -2] = -2;
              lVar39 = lVar39 + -1;
            } while (1 < lVar39);
          }
        }
      }
      if (isbwt == 0) {
        if (level0 == 0) {
          if (__s == __ptr) {
            uVar18 = 0;
            memset(__s,0,uVar21 * 4);
            do {
              if (cs == 4) {
                uVar24 = *(uint *)((long)T + uVar18 * 4);
              }
              else {
                uVar24 = (uint)*(byte *)((long)T + uVar18);
              }
              __s[(int)uVar24] = __s[(int)uVar24] + 1;
              uVar18 = uVar18 + 1;
            } while (uVar5 != uVar18);
          }
          uVar18 = 0;
          uVar24 = 0;
          do {
            uVar34 = __s[uVar18];
            __ptr[uVar18] = uVar24;
            uVar18 = uVar18 + 1;
            uVar24 = uVar34 + uVar24;
          } while (uVar21 != uVar18);
          if (cs == 4) {
            uVar24 = *(uint *)((long)T + uVar19 * 4);
          }
          else {
            uVar24 = (uint)*(byte *)((long)T + uVar19);
          }
          uVar34 = __ptr[(int)uVar24];
          if (1 < n) {
            if (cs == 4) {
              uVar36 = *(uint *)((long)T + uVar5 * 4 + -8);
            }
            else {
              uVar36 = (uint)*(byte *)((long)T + (uVar5 - 2));
            }
            if ((int)uVar36 < (int)uVar24) {
              uVar8 = -n;
            }
          }
          SA[(int)uVar34] = uVar8;
          uVar34 = uVar34 + 1;
          uVar18 = 0;
          do {
            uVar8 = SA[uVar18];
            lVar39 = (long)(int)uVar8;
            SA[uVar18] = ~uVar8;
            if (0 < lVar39) {
              uVar36 = uVar8 - 1;
              if (cs == 4) {
                uVar23 = *(uint *)((long)T + (ulong)uVar36 * 4);
                uVar31 = *(uint *)((long)T + lVar39 * 4);
              }
              else {
                uVar23 = (uint)*(byte *)((long)T + (ulong)uVar36);
                uVar31 = (uint)*(byte *)((long)T + lVar39);
              }
              if ((int)uVar23 < (int)uVar31) {
                __assert_fail("chr(j) >= chr(j + 1)",
                              "/workspace/llm4binary/github/license_c_cmakelists/jeffdaily[P]parasail/contrib/sais-lite-lcp/sais.c"
                              ,0x116,
                              "void induceSA(const void *, int *, int *, int *, int, int, int)");
              }
              if (cs == 4) {
                uVar23 = *(uint *)((long)T + (ulong)uVar36 * 4);
              }
              else {
                uVar23 = (uint)*(byte *)((long)T + (ulong)uVar36);
              }
              if (uVar23 != uVar24) {
                __ptr[(int)uVar24] = uVar34;
                uVar34 = __ptr[(int)uVar23];
                uVar24 = uVar23;
              }
              if ((long)(int)uVar34 <= (long)uVar18) {
                __assert_fail("i < bb",
                              "/workspace/llm4binary/github/license_c_cmakelists/jeffdaily[P]parasail/contrib/sais-lite-lcp/sais.c"
                              ,0x118,
                              "void induceSA(const void *, int *, int *, int *, int, int, int)");
              }
              if (uVar8 != 1) {
                if (cs == 4) {
                  uVar23 = *(uint *)((long)T + lVar39 * 4 + -8);
                }
                else {
                  uVar23 = (uint)*(byte *)((long)T + lVar39 + -2);
                }
                if ((int)uVar23 < (int)uVar24) {
                  uVar36 = -uVar8;
                }
              }
              SA[(int)uVar34] = uVar36;
              uVar34 = uVar34 + 1;
            }
            uVar18 = uVar18 + 1;
          } while (uVar5 != uVar18);
          if (__s == __ptr) {
            uVar18 = 0;
            memset(__s,0,uVar21 * 4);
            do {
              if (cs == 4) {
                uVar8 = *(uint *)((long)T + uVar18 * 4);
              }
              else {
                uVar8 = (uint)*(byte *)((long)T + uVar18);
              }
              __s[(int)uVar8] = __s[(int)uVar8] + 1;
              uVar18 = uVar18 + 1;
            } while (uVar5 != uVar18);
          }
          uVar5 = 0;
          uVar8 = 0;
          do {
            uVar8 = uVar8 + __s[uVar5];
            __ptr[uVar5] = uVar8;
            uVar5 = uVar5 + 1;
          } while (uVar21 != uVar5);
          uVar8 = *__ptr;
          uVar24 = 0;
          do {
            uVar34 = SA[uVar19];
            lVar39 = (long)(int)uVar34;
            if (lVar39 < 1) {
              SA[uVar19] = ~uVar34;
            }
            else {
              uVar36 = uVar34 - 1;
              if (cs == 4) {
                uVar23 = *(uint *)((long)T + (ulong)uVar36 * 4);
                uVar31 = *(uint *)((long)T + lVar39 * 4);
              }
              else {
                uVar23 = (uint)*(byte *)((long)T + (ulong)uVar36);
                uVar31 = (uint)*(byte *)((long)T + lVar39);
              }
              if ((int)uVar31 < (int)uVar23) {
                __assert_fail("chr(j) <= chr(j + 1)",
                              "/workspace/llm4binary/github/license_c_cmakelists/jeffdaily[P]parasail/contrib/sais-lite-lcp/sais.c"
                              ,0x123,
                              "void induceSA(const void *, int *, int *, int *, int, int, int)");
              }
              if (cs == 4) {
                uVar23 = *(uint *)((long)T + (ulong)uVar36 * 4);
              }
              else {
                uVar23 = (uint)*(byte *)((long)T + (ulong)uVar36);
              }
              if (uVar23 != uVar24) {
                __ptr[(int)uVar24] = uVar8;
                uVar8 = __ptr[(int)uVar23];
                uVar24 = uVar23;
              }
              lVar6 = (long)(int)uVar8;
              if ((long)uVar19 < lVar6) {
                __assert_fail("bb <= i",
                              "/workspace/llm4binary/github/license_c_cmakelists/jeffdaily[P]parasail/contrib/sais-lite-lcp/sais.c"
                              ,0x125,
                              "void induceSA(const void *, int *, int *, int *, int, int, int)");
              }
              if (uVar36 == 0) {
LAB_00110d2b:
                uVar36 = -uVar34;
              }
              else {
                if (cs == 4) {
                  uVar23 = *(uint *)((long)T + lVar39 * 4 + -8);
                }
                else {
                  uVar23 = (uint)*(byte *)((long)T + lVar39 + -2);
                }
                if ((int)uVar24 < (int)uVar23) goto LAB_00110d2b;
              }
              uVar8 = uVar8 - 1;
              SA[lVar6 + -1] = uVar36;
            }
            bVar40 = 0 < (long)uVar19;
            uVar19 = uVar19 - 1;
          } while (bVar40);
          iVar20 = 0;
        }
        else {
          sVar1 = uVar21 * 4;
          local_80 = malloc(sVar1);
          if ((local_80 == (void *)0x0) ||
             (local_78 = sVar1, pvVar15 = malloc(sVar1), pvVar15 == (void *)0x0)) {
LAB_00110e37:
            exit(-1);
          }
          uVar18 = 0;
          do {
            *(uint *)((long)pvVar15 + uVar18 * 4) = uVar8;
            uVar18 = uVar18 + 1;
          } while (uVar21 != uVar18);
          local_50 = pvVar15;
          if (__s == __ptr) {
            uVar18 = 0;
            memset(__s,0,local_78);
            do {
              if (cs == 4) {
                uVar24 = *(uint *)((long)T + uVar18 * 4);
              }
              else {
                uVar24 = (uint)*(byte *)((long)T + uVar18);
              }
              __s[(int)uVar24] = __s[(int)uVar24] + 1;
              uVar18 = uVar18 + 1;
            } while (uVar5 != uVar18);
          }
          uVar18 = 0;
          uVar24 = 0;
          do {
            uVar34 = __s[uVar18];
            __ptr[uVar18] = uVar24;
            uVar18 = uVar18 + 1;
            uVar24 = uVar34 + uVar24;
          } while (uVar21 != uVar18);
          memcpy(local_80,__ptr,local_78);
          if (cs == 4) {
            local_64 = *(uint *)((long)T + uVar19 * 4);
          }
          else {
            local_64 = (uint)*(byte *)((long)T + uVar19);
          }
          uVar24 = __ptr[(int)local_64];
          LCP[(int)uVar24] = 0;
          if (cs == 4) {
            uVar34 = *(uint *)((long)T + uVar5 * 4 + -8);
          }
          else {
            uVar34 = (uint)*(byte *)((long)T + (uVar5 - 2));
          }
          uVar36 = -n;
          if ((int)local_64 <= (int)uVar34) {
            uVar36 = uVar8;
          }
          SA[(int)uVar24] = uVar36;
          *LCP = 0;
          pvVar15 = malloc(local_78);
          if (pvVar15 == (void *)0x0) goto LAB_00110e37;
          uVar18 = (ulong)(uVar24 + 1);
          uVar14 = 0;
          uVar29 = 0;
          do {
            *(int *)((long)pvVar15 + uVar14 * 4) = (int)uVar29;
            uVar24 = (uint)(0 < (int)__s[uVar14]) + (int)uVar29;
            uVar29 = (ulong)uVar24;
            uVar14 = uVar14 + 1;
          } while (uVar21 != uVar14);
          local_40 = uVar29 * 4;
          pvVar27 = malloc(local_40);
          if (pvVar27 == (void *)0x0) goto LAB_00110e37;
          local_58 = uVar29;
          if (uVar24 != 0) {
            memset(pvVar27,0xff,uVar29 * 4);
            uVar24 = (uint)local_58;
          }
          local_48 = pvVar15;
          piVar7 = (int *)malloc((long)(int)(uVar24 * 2 + 0x80c) << 2);
          if (piVar7 == (int *)0x0) goto LAB_00110e37;
          local_70 = CONCAT44(local_70._4_4_,uVar24 * 2 + 0x808);
          piVar7[0] = -1;
          piVar7[1] = -1;
          iVar20 = 1;
          uVar14 = 0;
          do {
            sVar1 = local_40;
            uVar24 = SA[uVar14];
            lVar39 = (long)(int)uVar24;
            SA[uVar14] = ~uVar24;
            iVar9 = LCP[uVar14];
            uVar38 = (undefined4)uVar14;
            if (lVar39 < 1) {
              if (iVar9 == -1) {
                __assert_fail("lcp != -1",
                              "/workspace/llm4binary/github/license_c_cmakelists/jeffdaily[P]parasail/contrib/sais-lite-lcp/sais.c"
                              ,0x195,
                              "void induceSAandLCP(const void *, int *, int *, int *, int *, int, int, int)"
                             );
              }
              if (-1 < iVar9) {
                lVar39 = (long)iVar20;
                iVar20 = iVar20 + 4;
                lVar6 = (lVar39 << 0x20) + 0x200000000;
                piVar16 = piVar7 + lVar39;
                do {
                  lVar6 = lVar6 + -0x200000000;
                  iVar20 = iVar20 + -2;
                  iVar17 = *piVar16;
                  piVar16 = piVar16 + -2;
                } while (iVar9 <= iVar17);
                *(undefined4 *)((long)piVar7 + (lVar6 >> 0x1e) + 4) = uVar38;
                piVar7[iVar20] = iVar9;
              }
            }
            else {
              if (iVar9 == -1) {
                if (cs == 4) {
                  uVar34 = *(uint *)((long)T + lVar39 * 4);
                }
                else {
                  uVar34 = (uint)*(byte *)((long)T + lVar39);
                }
                lVar6 = 0;
                do {
                  if (cs == 4) {
                    uVar36 = *(uint *)((long)T + lVar6 * 4 + (ulong)uVar24 * 4);
                  }
                  else {
                    uVar36 = (uint)*(byte *)((long)T + lVar6 + (ulong)uVar24);
                  }
                  lVar26 = (long)(*(int *)((long)local_50 + (long)(int)uVar34 * 4) + (int)lVar6);
                  if (cs == 4) {
                    uVar23 = *(uint *)((long)T + lVar26 * 4);
                  }
                  else {
                    uVar23 = (uint)*(byte *)((long)T + lVar26);
                  }
                  lVar6 = lVar6 + 1;
                } while (uVar36 == uVar23);
                iVar9 = (int)lVar6 + -1;
              }
              uVar34 = uVar24 - 1;
              uVar28 = (ulong)uVar34;
              if (cs == 4) {
                uVar36 = *(uint *)((long)T + uVar28 * 4);
                uVar23 = *(uint *)((long)T + lVar39 * 4);
              }
              else {
                uVar36 = (uint)*(byte *)((long)T + uVar28);
                uVar23 = (uint)*(byte *)((long)T + lVar39);
              }
              if ((int)uVar36 < (int)uVar23) {
                __assert_fail("chr(j) >= chr(j + 1)",
                              "/workspace/llm4binary/github/license_c_cmakelists/jeffdaily[P]parasail/contrib/sais-lite-lcp/sais.c"
                              ,0x17a,
                              "void induceSAandLCP(const void *, int *, int *, int *, int *, int, int, int)"
                             );
              }
              if (cs == 4) {
                uVar36 = *(uint *)((long)T + uVar28 * 4);
              }
              else {
                uVar36 = (uint)*(byte *)((long)T + uVar28);
              }
              lVar6 = (long)(int)uVar36;
              if (uVar36 != local_64) {
                __ptr[(int)local_64] = (uint)uVar18;
                uVar18 = (ulong)__ptr[lVar6];
                local_64 = uVar36;
              }
              iVar17 = (int)uVar18;
              lVar26 = (long)iVar17;
              if (lVar26 <= (long)uVar14) {
                __assert_fail("i < bb",
                              "/workspace/llm4binary/github/license_c_cmakelists/jeffdaily[P]parasail/contrib/sais-lite-lcp/sais.c"
                              ,0x17f,
                              "void induceSAandLCP(const void *, int *, int *, int *, int *, int, int, int)"
                             );
              }
              *(uint *)((long)local_50 + lVar6 * 4) = uVar34;
              if (uVar24 != 1) {
                if (cs == 4) {
                  uVar23 = *(uint *)((long)T + lVar39 * 4 + -8);
                }
                else {
                  uVar23 = (uint)*(byte *)((long)T + lVar39 + -2);
                }
                if ((int)uVar23 < (int)uVar36) {
                  uVar34 = -uVar24;
                }
              }
              SA[lVar26] = uVar34;
              if (iVar9 < 0) {
                __assert_fail("lcp >= 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/jeffdaily[P]parasail/contrib/sais-lite-lcp/sais.c"
                              ,0x184,
                              "void induceSAandLCP(const void *, int *, int *, int *, int *, int, int, int)"
                             );
              }
              lVar12 = ((long)iVar20 << 0x20) + 0x200000000;
              iVar32 = iVar20 + -1;
              lVar39 = (long)iVar20 + 2;
              iVar20 = iVar20 + 4;
              do {
                iVar35 = iVar32;
                iVar20 = iVar20 + -2;
                lVar30 = lVar39 + -2;
                lVar12 = lVar12 + -0x200000000;
                lVar3 = lVar39 + -2;
                lVar39 = lVar30;
                iVar32 = iVar35 + -2;
              } while (iVar9 <= piVar7[lVar3]);
              *(undefined4 *)((long)piVar7 + (lVar12 >> 0x1e) + 4) = uVar38;
              piVar7[iVar20] = iVar9;
              if (lVar30 < 1) {
                __assert_fail("stack_end-3 >= 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/jeffdaily[P]parasail/contrib/sais-lite-lcp/sais.c"
                              ,0x18a,
                              "void induceSAandLCP(const void *, int *, int *, int *, int *, int, int, int)"
                             );
              }
              lVar39 = (long)*(int *)((long)local_48 + lVar6 * 4);
              piVar16 = piVar7 + iVar35;
              do {
                piVar13 = piVar16;
                piVar16 = piVar13 + -2;
              } while (*(int *)((long)pvVar27 + lVar39 * 4) < *piVar13);
              iVar9 = 0;
              if (iVar17 != *(int *)((long)local_80 + lVar6 * 4)) {
                iVar9 = piVar13[3] + 1;
              }
              LCP[lVar26] = iVar9;
              *(undefined4 *)((long)pvVar27 + lVar39 * 4) = uVar38;
              uVar18 = (ulong)(iVar17 + 1);
            }
            if ((int)local_70 < iVar20) {
              local_38 = uVar18;
              pvVar15 = malloc(local_40);
              if (pvVar15 == (void *)0x0) goto LAB_00110e37;
              memcpy(pvVar15,pvVar27,sVar1);
              qsort(pvVar15,uVar29,4,int_cmp);
              if ((int)local_58 == 0) {
                iVar9 = 1;
              }
              else {
                iVar9 = 1;
                iVar17 = 2;
                uVar18 = 0;
                do {
                  iVar32 = *(int *)((long)pvVar15 + uVar18 * 4);
                  if (piVar7[(long)iVar9 + -1] <= iVar32) {
                    bVar40 = iVar17 < iVar20;
                    if (iVar17 < iVar20) {
                      lVar39 = (long)iVar17;
                      bVar40 = true;
                      iVar35 = piVar7[lVar39];
                      while (iVar35 <= iVar32) {
                        lVar39 = lVar39 + 2;
                        bVar40 = lVar39 < iVar20;
                        if (iVar20 <= lVar39) {
                          iVar17 = iVar17 + 2;
                          break;
                        }
                        iVar17 = iVar17 + 2;
                        iVar35 = piVar7[lVar39];
                      }
                    }
                    if (iVar20 < iVar17) break;
                    if (!bVar40) {
                      __assert_fail("l < stack_end",
                                    "/workspace/llm4binary/github/license_c_cmakelists/jeffdaily[P]parasail/contrib/sais-lite-lcp/sais.c"
                                    ,0x1a8,
                                    "void induceSAandLCP(const void *, int *, int *, int *, int *, int, int, int)"
                                   );
                    }
                    piVar7[(long)iVar9 + 1] = piVar7[iVar17];
                    piVar7[(long)iVar9 + 2] = piVar7[(long)iVar17 + 1];
                    iVar9 = iVar9 + 2;
                  }
                  uVar18 = uVar18 + 1;
                } while (uVar18 != uVar29);
              }
              iVar20 = iVar9;
              free(pvVar15);
              uVar18 = local_38;
            }
            uVar14 = uVar14 + 1;
          } while (uVar14 != uVar5);
          if (__s == __ptr) {
            uVar18 = 0;
            memset(__s,0,local_78);
            do {
              if (cs == 4) {
                uVar24 = *(uint *)((long)T + uVar18 * 4);
              }
              else {
                uVar24 = (uint)*(byte *)((long)T + uVar18);
              }
              __s[(int)uVar24] = __s[(int)uVar24] + 1;
              uVar18 = uVar18 + 1;
            } while (uVar5 != uVar18);
          }
          uVar5 = 0;
          uVar24 = 0;
          do {
            uVar24 = uVar24 + __s[uVar5];
            __ptr[uVar5] = uVar24;
            uVar5 = uVar5 + 1;
          } while (uVar21 != uVar5);
          if ((int)local_58 != 0) {
            uVar21 = 0;
            do {
              *(uint *)((long)pvVar27 + uVar21 * 4) = uVar8;
              uVar21 = uVar21 + 1;
            } while (uVar29 != uVar21);
          }
          *piVar7 = n;
          piVar7[1] = -1;
          uVar8 = *__ptr;
          iVar20 = 1;
          uVar24 = 0;
          do {
            sVar1 = local_40;
            iVar9 = LCP[uVar19];
            if ((iVar9 < 0 && uVar19 != 0) && (-1 < LCP[uVar19 - 1])) {
              lVar39 = (long)(SA[uVar19] >> 0x1f ^ SA[uVar19]);
              lVar26 = (long)(SA[uVar19 - 1] >> 0x1f ^ SA[uVar19 - 1]);
              lVar6 = 0;
              do {
                if (cs == 4) {
                  uVar34 = *(uint *)((long)T + lVar6 * 4 + lVar39 * 4);
                  uVar36 = *(uint *)((long)T + lVar6 * 4 + lVar26 * 4);
                }
                else {
                  uVar34 = (uint)*(byte *)((long)T + lVar6 + lVar39);
                  uVar36 = (uint)*(byte *)((long)T + lVar6 + lVar26);
                }
                lVar6 = lVar6 + 1;
              } while (uVar34 == uVar36);
              iVar9 = (int)lVar6 + -1;
              LCP[uVar19] = iVar9;
            }
            uVar34 = SA[uVar19];
            lVar39 = (long)(int)uVar34;
            if (lVar39 < 1) {
              SA[uVar19] = ~uVar34;
            }
            else {
              uVar36 = uVar34 - 1;
              if (cs == 4) {
                uVar23 = *(uint *)((long)T + (ulong)uVar36 * 4);
                uVar31 = *(uint *)((long)T + lVar39 * 4);
              }
              else {
                uVar23 = (uint)*(byte *)((long)T + (ulong)uVar36);
                uVar31 = (uint)*(byte *)((long)T + lVar39);
              }
              if ((int)uVar31 < (int)uVar23) {
                __assert_fail("chr(j) <= chr(j + 1)",
                              "/workspace/llm4binary/github/license_c_cmakelists/jeffdaily[P]parasail/contrib/sais-lite-lcp/sais.c"
                              ,0x1c6,
                              "void induceSAandLCP(const void *, int *, int *, int *, int *, int, int, int)"
                             );
              }
              if (cs == 4) {
                uVar23 = *(uint *)((long)T + (ulong)uVar36 * 4);
              }
              else {
                uVar23 = (uint)*(byte *)((long)T + (ulong)uVar36);
              }
              if (uVar23 != uVar24) {
                __ptr[(int)uVar24] = uVar8;
                uVar8 = __ptr[(int)uVar23];
                uVar24 = uVar23;
              }
              lVar6 = (long)(int)uVar8;
              if ((long)uVar19 < lVar6) {
                __assert_fail("bb <= i",
                              "/workspace/llm4binary/github/license_c_cmakelists/jeffdaily[P]parasail/contrib/sais-lite-lcp/sais.c"
                              ,0x1ca,
                              "void induceSAandLCP(const void *, int *, int *, int *, int *, int, int, int)"
                             );
              }
              if (uVar36 == 0) {
LAB_001106ee:
                uVar36 = -uVar34;
              }
              else {
                if (cs == 4) {
                  uVar31 = *(uint *)((long)T + lVar39 * 4 + -8);
                }
                else {
                  uVar31 = (uint)*(byte *)((long)T + lVar39 + -2);
                }
                if ((int)uVar23 < (int)uVar31) goto LAB_001106ee;
              }
              SA[lVar6 + -1] = uVar36;
              if ((int)local_60 <= (int)(uVar23 + 1)) {
                __assert_fail("c0+1<k",
                              "/workspace/llm4binary/github/license_c_cmakelists/jeffdaily[P]parasail/contrib/sais-lite-lcp/sais.c"
                              ,0x1cc,
                              "void induceSAandLCP(const void *, int *, int *, int *, int *, int, int, int)"
                             );
              }
              if (iVar20 < 1) {
                __assert_fail("stack_end-1 >= 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/jeffdaily[P]parasail/contrib/sais-lite-lcp/sais.c"
                              ,0x1d0,
                              "void induceSAandLCP(const void *, int *, int *, int *, int *, int, int, int)"
                             );
              }
              lVar39 = (long)*(int *)((long)local_48 + (long)(int)uVar23 * 4);
              piVar16 = piVar7 + (long)iVar20 + -1;
              do {
                piVar13 = piVar16;
                piVar16 = piVar13 + -2;
              } while (*piVar13 <= *(int *)((long)pvVar27 + lVar39 * 4));
              iVar17 = 0;
              if (uVar8 != *(uint *)((long)local_80 + (long)(int)(uVar23 + 1) * 4)) {
                iVar17 = piVar13[3] + 1;
              }
              LCP[lVar6] = iVar17;
              if (uVar19 == uVar8) {
                iVar9 = LCP[uVar19];
              }
              *(int *)((long)pvVar27 + lVar39 * 4) = (int)uVar19;
              uVar8 = uVar8 - 1;
            }
            if (iVar9 < 0) {
              __assert_fail("lcp >= 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/jeffdaily[P]parasail/contrib/sais-lite-lcp/sais.c"
                            ,0x1db,
                            "void induceSAandLCP(const void *, int *, int *, int *, int *, int, int, int)"
                           );
            }
            lVar39 = (long)iVar20;
            lVar6 = (lVar39 << 0x20) + 0x200000000;
            iVar20 = iVar20 + 4;
            do {
              lVar6 = lVar6 + -0x200000000;
              iVar20 = iVar20 + -2;
              if (lVar39 < 0) break;
              piVar16 = piVar7 + lVar39;
              lVar39 = lVar39 + -2;
            } while (iVar9 <= *piVar16);
            *(int *)((long)piVar7 + (lVar6 >> 0x1e) + 4) = (int)uVar19;
            piVar7[iVar20] = iVar9;
            if ((int)local_70 < iVar20) {
              pvVar15 = malloc(local_40);
              if (pvVar15 == (void *)0x0) goto LAB_00110e37;
              memcpy(pvVar15,pvVar27,sVar1);
              qsort(pvVar15,uVar29,4,int_cmp);
              if ((int)local_58 == 0) {
                iVar9 = 1;
              }
              else {
                iVar9 = 1;
                uVar21 = 2;
                uVar5 = uVar29;
                do {
                  iVar17 = *(int *)((long)pvVar15 + uVar5 * 4 + -4);
                  if (iVar17 < piVar7[(long)iVar9 + -1]) {
                    iVar32 = (int)uVar21;
                    bVar40 = iVar32 < iVar20;
                    if (iVar32 < iVar20) {
                      bVar40 = true;
                      iVar35 = piVar7[iVar32];
                      uVar18 = (long)iVar32;
                      while (iVar17 < iVar35) {
                        bVar40 = (long)uVar18 < lVar6 >> 0x20;
                        if (lVar6 >> 0x20 <= (long)uVar18) {
                          uVar21 = (ulong)((int)uVar18 + 2);
                          break;
                        }
                        uVar21 = uVar18 + 2;
                        iVar35 = piVar7[uVar18 + 2];
                        uVar18 = uVar21;
                      }
                    }
                    iVar17 = (int)uVar21;
                    if (iVar20 < iVar17) break;
                    if (!bVar40) {
                      __assert_fail("l < stack_end",
                                    "/workspace/llm4binary/github/license_c_cmakelists/jeffdaily[P]parasail/contrib/sais-lite-lcp/sais.c"
                                    ,0x1ec,
                                    "void induceSAandLCP(const void *, int *, int *, int *, int *, int, int, int)"
                                   );
                    }
                    piVar7[(long)iVar9 + 1] = piVar7[iVar17];
                    piVar7[(long)iVar9 + 2] = piVar7[(long)iVar17 + 1];
                    iVar9 = iVar9 + 2;
                  }
                  bVar40 = 1 < (long)uVar5;
                  uVar5 = uVar5 - 1;
                } while (bVar40);
              }
              iVar20 = iVar9;
              free(pvVar15);
            }
            bVar40 = 0 < (long)uVar19;
            uVar19 = uVar19 - 1;
          } while (bVar40);
          free(local_80);
          free(pvVar27);
          free(piVar7);
          free(local_48);
          free(local_50);
          iVar20 = 0;
        }
      }
      else {
        if (__s == __ptr) {
          uVar18 = 0;
          memset(__s,0,uVar21 * 4);
          do {
            if (cs == 4) {
              uVar24 = *(uint *)((long)T + uVar18 * 4);
            }
            else {
              uVar24 = (uint)*(byte *)((long)T + uVar18);
            }
            __s[(int)uVar24] = __s[(int)uVar24] + 1;
            uVar18 = uVar18 + 1;
          } while (uVar5 != uVar18);
        }
        uVar18 = 0;
        uVar24 = 0;
        do {
          uVar34 = __s[uVar18];
          __ptr[uVar18] = uVar24;
          uVar18 = uVar18 + 1;
          uVar24 = uVar34 + uVar24;
        } while (uVar21 != uVar18);
        if (cs == 4) {
          uVar24 = *(uint *)((long)T + uVar19 * 4);
        }
        else {
          uVar24 = (uint)*(byte *)((long)T + uVar19);
        }
        uVar34 = __ptr[(int)uVar24];
        if (1 < n) {
          if (cs == 4) {
            uVar36 = *(uint *)((long)T + uVar5 * 4 + -8);
          }
          else {
            uVar36 = (uint)*(byte *)((long)T + (uVar5 - 2));
          }
          if ((int)uVar36 < (int)uVar24) {
            uVar8 = -n;
          }
        }
        SA[(int)uVar34] = uVar8;
        puVar4 = (uint *)(SA + (int)uVar34 + 1);
        uVar18 = 0;
        do {
          uVar8 = SA[uVar18];
          lVar39 = (long)(int)uVar8;
          if (lVar39 < 1) {
            if (uVar8 != 0) {
              SA[uVar18] = ~uVar8;
            }
          }
          else {
            uVar34 = uVar8 - 1;
            if (cs == 4) {
              uVar36 = *(uint *)((long)T + (ulong)uVar34 * 4);
              uVar23 = *(uint *)((long)T + lVar39 * 4);
            }
            else {
              uVar36 = (uint)*(byte *)((long)T + (ulong)uVar34);
              uVar23 = (uint)*(byte *)((long)T + lVar39);
            }
            if ((int)uVar36 < (int)uVar23) {
              __assert_fail("chr(j) >= chr(j + 1)",
                            "/workspace/llm4binary/github/license_c_cmakelists/jeffdaily[P]parasail/contrib/sais-lite-lcp/sais.c"
                            ,0x20d,
                            "int computeBWT(const void *, int *, int *, int *, int, int, int)");
            }
            if (cs == 4) {
              uVar36 = *(uint *)((long)T + (ulong)uVar34 * 4);
            }
            else {
              uVar36 = (uint)*(byte *)((long)T + (ulong)uVar34);
            }
            SA[uVar18] = ~uVar36;
            if (uVar36 != uVar24) {
              __ptr[(int)uVar24] = (uint)((ulong)((long)puVar4 - (long)SA) >> 2);
              puVar4 = (uint *)(SA + (int)__ptr[(int)uVar36]);
              uVar24 = uVar36;
            }
            if ((long)puVar4 - (long)SA >> 2 <= (long)uVar18) {
              __assert_fail("i < (b - SA)",
                            "/workspace/llm4binary/github/license_c_cmakelists/jeffdaily[P]parasail/contrib/sais-lite-lcp/sais.c"
                            ,0x210,
                            "int computeBWT(const void *, int *, int *, int *, int, int, int)");
            }
            if (uVar8 != 1) {
              if (cs == 4) {
                uVar36 = *(uint *)((long)T + lVar39 * 4 + -8);
              }
              else {
                uVar36 = (uint)*(byte *)((long)T + lVar39 + -2);
              }
              if ((int)uVar36 < (int)uVar24) {
                uVar34 = -uVar8;
              }
            }
            *puVar4 = uVar34;
            puVar4 = puVar4 + 1;
          }
          uVar18 = uVar18 + 1;
        } while (uVar5 != uVar18);
        if (__s == __ptr) {
          uVar18 = 0;
          memset(__s,0,uVar21 * 4);
          do {
            if (cs == 4) {
              uVar8 = *(uint *)((long)T + uVar18 * 4);
            }
            else {
              uVar8 = (uint)*(byte *)((long)T + uVar18);
            }
            __s[(int)uVar8] = __s[(int)uVar8] + 1;
            uVar18 = uVar18 + 1;
          } while (uVar5 != uVar18);
        }
        uVar5 = 0;
        uVar8 = 0;
        do {
          uVar8 = uVar8 + __s[uVar5];
          __ptr[uVar5] = uVar8;
          uVar5 = uVar5 + 1;
        } while (uVar21 != uVar5);
        piVar7 = SA + (int)*__ptr;
        uVar21 = 0xffffffff;
        uVar8 = 0;
        do {
          uVar24 = SA[uVar19];
          lVar39 = (long)(int)uVar24;
          if (lVar39 < 1) {
            if (uVar24 == 0) {
              uVar21 = uVar19 & 0xffffffff;
            }
            else {
              SA[uVar19] = ~uVar24;
            }
          }
          else {
            uVar34 = uVar24 - 1;
            if (cs == 4) {
              uVar36 = *(uint *)((long)T + (ulong)uVar34 * 4);
              uVar23 = *(uint *)((long)T + lVar39 * 4);
            }
            else {
              uVar36 = (uint)*(byte *)((long)T + (ulong)uVar34);
              uVar23 = (uint)*(byte *)((long)T + lVar39);
            }
            if ((int)uVar23 < (int)uVar36) {
              __assert_fail("chr(j) <= chr(j + 1)",
                            "/workspace/llm4binary/github/license_c_cmakelists/jeffdaily[P]parasail/contrib/sais-lite-lcp/sais.c"
                            ,0x21c,
                            "int computeBWT(const void *, int *, int *, int *, int, int, int)");
            }
            if (cs == 4) {
              uVar36 = *(uint *)((long)T + (ulong)uVar34 * 4);
            }
            else {
              uVar36 = (uint)*(byte *)((long)T + (ulong)uVar34);
            }
            SA[uVar19] = uVar36;
            if (uVar36 != uVar8) {
              __ptr[(int)uVar8] = (uint)((ulong)((long)piVar7 - (long)SA) >> 2);
              piVar7 = SA + (int)__ptr[(int)uVar36];
              uVar8 = uVar36;
            }
            if ((long)uVar19 < (long)piVar7 - (long)SA >> 2) {
              __assert_fail("(b - SA) <= i",
                            "/workspace/llm4binary/github/license_c_cmakelists/jeffdaily[P]parasail/contrib/sais-lite-lcp/sais.c"
                            ,0x21f,
                            "int computeBWT(const void *, int *, int *, int *, int, int, int)");
            }
            if (uVar24 != 1) {
              if (cs == 4) {
                uVar24 = *(uint *)((long)T + lVar39 * 4 + -8);
              }
              else {
                uVar24 = (uint)*(byte *)((long)T + lVar39 + -2);
              }
              if ((int)uVar8 < (int)uVar24) {
                if (cs == 4) {
                  uVar34 = *(uint *)((long)T + lVar39 * 4 + -8);
                }
                else {
                  uVar34 = (uint)*(byte *)((long)T + lVar39 + -2);
                }
                uVar34 = ~uVar34;
              }
            }
            piVar7[-1] = uVar34;
            piVar7 = piVar7 + -1;
          }
          iVar20 = (int)uVar21;
          bVar40 = 0 < (long)uVar19;
          uVar19 = uVar19 - 1;
        } while (bVar40);
      }
      if ((bVar22 & 5) != 0) {
        free(__s);
      }
      goto LAB_00110d5a;
    }
    if ((bVar22 & 4) != 0) {
      free(__s);
    }
    if ((bVar22 & 2) != 0) {
      free(__ptr);
    }
    iVar9 = fs + n + uVar24 * -2;
    if ((bVar22 & 0xd) == 0) {
      if (iVar9 < (int)local_60 + iVar20) {
        bVar22 = bVar22 | 8;
      }
      else {
        iVar9 = iVar9 - (int)local_60;
      }
    }
    if ((int)(iVar9 + uVar24) < (int)((uint)n >> 1)) {
      __assert_fail("(n >> 1) <= (newfs + m)",
                    "/workspace/llm4binary/github/license_c_cmakelists/jeffdaily[P]parasail/contrib/sais-lite-lcp/sais.c"
                    ,0x292,"int sais_main(const void *, int *, int *, int, int, int, int, int, int)"
                   );
    }
    lVar39 = (long)(int)uVar24;
    piVar7 = SA + lVar39 + iVar9;
    iVar17 = uVar24 - 1;
    if (1 < (uint)n) {
      lVar6 = (long)(int)(((uint)n >> 1) + uVar24);
      iVar32 = iVar17;
      do {
        if (SA[lVar6 + -1] != 0) {
          lVar26 = (long)iVar32;
          iVar32 = iVar32 + -1;
          piVar7[lVar26] = SA[lVar6 + -1] + -1;
        }
        lVar6 = lVar6 + -1;
      } while (lVar39 < lVar6);
    }
    iVar20 = sais_main(piVar7,SA,(int *)0x0,iVar9,uVar24,iVar20,4,0,0);
    if (iVar20 == 0) {
      uVar18 = uVar19;
      if (cs == 4) {
        uVar36 = *(uint *)((long)T + uVar19 * 4);
        iVar20 = n;
      }
      else {
        uVar36 = (uint)*(byte *)((long)T + uVar19);
        iVar20 = n;
      }
      do {
        iVar9 = iVar20;
        iVar20 = iVar9 + -1;
        if (iVar20 < 1) {
          iVar20 = (int)local_80;
          goto LAB_0010fd31;
        }
        uVar14 = uVar18 - 1 & 0xffffffff;
        if (cs == 4) {
          uVar23 = *(uint *)((long)T + uVar14 * 4);
        }
        else {
          uVar23 = (uint)*(byte *)((long)T + uVar14);
        }
        bVar40 = (int)uVar36 <= (int)uVar23;
        uVar36 = uVar23;
        uVar18 = uVar18 - 1;
      } while (bVar40);
      uVar34 = iVar9 - 2;
LAB_0010fd31:
      if (0 < iVar20) {
        do {
          uVar18 = (ulong)uVar34;
          uVar23 = (int)uVar34 >> 0x1f & uVar34;
          do {
            uVar10 = uVar34;
            uVar18 = uVar18 - 1;
            uVar31 = uVar36;
            uVar37 = uVar23;
            uVar11 = uVar23 - 1;
            if ((int)uVar10 < 1) break;
            if (cs == 4) {
              uVar31 = *(uint *)((long)T + (uVar18 & 0xffffffff) * 4);
            }
            else {
              uVar31 = (uint)*(byte *)((long)T + (uVar18 & 0xffffffff));
            }
            uVar11 = uVar10 - 1;
            bVar40 = (int)uVar31 <= (int)uVar36;
            uVar37 = uVar10;
            uVar36 = uVar31;
            uVar34 = uVar11;
          } while (bVar40);
          uVar34 = 0xffffffff;
          uVar36 = uVar31;
          if (0 < (int)uVar10) {
            lVar6 = (long)iVar17;
            iVar17 = iVar17 + -1;
            piVar7[lVar6] = uVar37;
            uVar23 = uVar11;
            do {
              uVar11 = uVar11 - 1;
              uVar34 = 0xffffffff;
              uVar36 = uVar31;
              if ((int)uVar23 < 1) break;
              if (cs == 4) {
                uVar36 = *(uint *)((long)T + (ulong)uVar11 * 4);
              }
              else {
                uVar36 = (uint)*(byte *)((long)T + (ulong)uVar11);
              }
              uVar34 = uVar23 - 1;
              bVar40 = (int)uVar31 <= (int)uVar36;
              uVar31 = uVar36;
              uVar23 = uVar34;
            } while (bVar40);
          }
        } while (-1 < (int)uVar34);
      }
      if (level0 != 0) {
        piVar7[lVar39] = n;
        iVar20 = *SA;
        if ((int)uVar24 < (int)((uint)n / 3)) {
          LCP[lVar39 + iVar20 * 2] = uVar8;
          LCP[lVar39 + (iVar20 * 2 + 1)] = 0;
          if (1 < (int)uVar24) {
            uVar18 = 1;
            do {
              lVar6 = (long)iVar20;
              iVar20 = SA[uVar18];
              LCP[lVar39 + iVar20 * 2] = piVar7[lVar6];
              LCP[lVar39 + (iVar20 * 2 + 1)] = piVar7[lVar6 + 1] - piVar7[lVar6];
              uVar18 = uVar18 + 1;
            } while (local_e8 != uVar18);
          }
          if (0 < n) {
            uVar18 = 0;
            uVar34 = 0;
            iVar20 = 0;
            pvVar15 = T;
            pvVar27 = T;
            do {
              if (uVar18 == (uint)piVar7[iVar20]) {
                uVar36 = iVar20 * 2;
                uVar14 = (ulong)uVar34;
                if ((int)uVar34 < 1) {
                  uVar14 = 0;
                }
                do {
                  if (cs == 4) {
                    uVar34 = *(uint *)((long)pvVar27 + uVar14 * 4);
                  }
                  else {
                    uVar34 = (uint)*(byte *)((long)pvVar15 + uVar14);
                  }
                  iVar9 = (int)uVar14;
                  if (cs == 4) {
                    uVar23 = *(uint *)((long)T + (long)(LCP[lVar39 + (int)uVar36] + iVar9) * 4);
                  }
                  else {
                    uVar23 = (uint)*(byte *)((long)T + (long)(LCP[lVar39 + (int)uVar36] + iVar9));
                  }
                  uVar14 = uVar14 + 1;
                } while (uVar34 == uVar23);
                t = LCP[lVar39 + (int)(uVar36 | 1)];
                uVar34 = piVar7[(long)iVar20 + 1] - piVar7[iVar20];
                if ((int)uVar34 < t) {
                  uVar34 = t;
                }
                LCP[lVar39 + (int)uVar36] = iVar9;
                uVar34 = ~uVar34 + (int)uVar14;
                iVar20 = iVar20 + 1;
              }
              uVar18 = uVar18 + 1;
              pvVar27 = (void *)((long)pvVar27 + 4);
              pvVar15 = (void *)((long)pvVar15 + 1);
            } while (uVar18 != uVar5);
          }
          if (0 < (int)uVar24) {
            uVar18 = 0;
            do {
              LCP[uVar18] = LCP[lVar39 + SA[uVar18] * 2];
              uVar18 = uVar18 + 1;
            } while (local_e8 != uVar18);
          }
        }
        else {
          LCP[iVar20] = uVar8;
          LCP[lVar39 + iVar20] = 0;
          if (1 < (int)uVar24) {
            uVar18 = 1;
            do {
              lVar6 = (long)iVar20;
              iVar20 = SA[uVar18];
              LCP[iVar20] = piVar7[lVar6];
              LCP[lVar39 + iVar20] = piVar7[lVar6 + 1] - piVar7[lVar6];
              uVar18 = uVar18 + 1;
            } while (local_e8 != uVar18);
          }
          if (0 < n) {
            uVar18 = 0;
            uVar34 = 0;
            iVar20 = 0;
            pvVar15 = T;
            pvVar27 = T;
            do {
              if (uVar18 == (uint)piVar7[iVar20]) {
                uVar14 = (ulong)uVar34;
                if ((int)uVar34 < 1) {
                  uVar14 = 0;
                }
                do {
                  if (cs == 4) {
                    uVar34 = *(uint *)((long)pvVar27 + uVar14 * 4);
                  }
                  else {
                    uVar34 = (uint)*(byte *)((long)pvVar15 + uVar14);
                  }
                  iVar9 = (int)uVar14;
                  if (cs == 4) {
                    uVar36 = *(uint *)((long)T + (long)(LCP[iVar20] + iVar9) * 4);
                  }
                  else {
                    uVar36 = (uint)*(byte *)((long)T + (long)(LCP[iVar20] + iVar9));
                  }
                  uVar14 = uVar14 + 1;
                } while (uVar34 == uVar36);
                t = LCP[lVar39 + iVar20];
                uVar34 = piVar7[(long)iVar20 + 1] - piVar7[iVar20];
                if ((int)uVar34 < t) {
                  uVar34 = t;
                }
                LCP[lVar39 + iVar20] = iVar9;
                uVar34 = ~uVar34 + (int)uVar14;
                iVar20 = iVar20 + 1;
              }
              uVar18 = uVar18 + 1;
              pvVar27 = (void *)((long)pvVar27 + 4);
              pvVar15 = (void *)((long)pvVar15 + 1);
            } while (uVar18 != uVar5);
          }
          if (0 < (int)uVar24) {
            uVar18 = 0;
            do {
              LCP[uVar18] = LCP[lVar39 + SA[uVar18]];
              uVar18 = uVar18 + 1;
            } while (local_e8 != uVar18);
          }
        }
      }
      if (0 < (int)uVar24) {
        uVar18 = 0;
        do {
          SA[uVar18] = piVar7[SA[uVar18]];
          uVar18 = uVar18 + 1;
        } while (local_e8 != uVar18);
      }
      if (((bVar22 & 4) != 0) && (__s = (uint *)malloc(uVar21 * 4), __ptr = __s, __s == (uint *)0x0)
         ) {
        return -2;
      }
      if (((bVar22 & 2) == 0) || (__ptr = (uint *)malloc(uVar21 * 4), __ptr != (uint *)0x0))
      goto LAB_0010f53c;
    }
    iVar20 = -2;
    bVar22 = bVar22 & 1;
  }
  else {
    if ((bVar22 & 0x30) == 0) {
      if (__s == __ptr) {
        uVar14 = 0;
        memset(__s,0,uVar21 * 4);
        do {
          if (cs == 4) {
            uVar36 = *(uint *)((long)T + uVar14 * 4);
          }
          else {
            uVar36 = (uint)*(byte *)((long)T + uVar14);
          }
          __s[(int)uVar36] = __s[(int)uVar36] + 1;
          uVar14 = uVar14 + 1;
        } while (uVar5 != uVar14);
      }
      uVar14 = 0;
      uVar36 = 0;
      do {
        uVar23 = __s[uVar14];
        __ptr[uVar14] = uVar36;
        uVar14 = uVar14 + 1;
        uVar36 = uVar23 + uVar36;
      } while (uVar21 != uVar14);
      if (cs == 4) {
        uVar36 = *(uint *)((long)T + uVar19 * 4);
      }
      else {
        uVar36 = (uint)*(byte *)((long)T + uVar19);
      }
      lVar39 = (long)n + -2;
      uVar23 = __ptr[(int)uVar36];
      if (cs == 4) {
        uVar31 = *(uint *)((long)T + (long)n * 4 + -8);
      }
      else {
        uVar31 = (uint)*(byte *)((long)T + lVar39);
      }
      iVar20 = 1 - n;
      if ((int)uVar36 <= (int)uVar31) {
        iVar20 = (int)lVar39;
      }
      SA[(int)uVar23] = iVar20;
      uVar23 = uVar23 + 1;
      uVar14 = 0;
      do {
        uVar31 = SA[uVar14];
        lVar39 = (long)(int)uVar31;
        if (lVar39 < 1) {
          if ((int)uVar31 < 0) {
            uVar31 = ~uVar31;
            goto LAB_0010f098;
          }
        }
        else {
          if (cs == 4) {
            uVar11 = *(uint *)((long)T + lVar39 * 4);
            uVar37 = *(uint *)((long)T + lVar39 * 4 + 4);
          }
          else {
            uVar11 = (uint)*(byte *)((long)T + lVar39);
            uVar37 = (uint)*(byte *)((long)T + lVar39 + 1);
          }
          if ((int)uVar11 < (int)uVar37) {
            __assert_fail("chr(j) >= chr(j + 1)",
                          "/workspace/llm4binary/github/license_c_cmakelists/jeffdaily[P]parasail/contrib/sais-lite-lcp/sais.c"
                          ,0x5b,"void LMSsort1(const void *, int *, int *, int *, int, int, int)");
          }
          if (cs == 4) {
            uVar11 = *(uint *)((long)T + lVar39 * 4);
          }
          else {
            uVar11 = (uint)*(byte *)((long)T + lVar39);
          }
          if (uVar11 != uVar36) {
            __ptr[(int)uVar36] = uVar23;
            uVar23 = __ptr[(int)uVar11];
            uVar36 = uVar11;
          }
          if ((long)(int)uVar23 <= (long)uVar14) {
            __assert_fail("i < bb",
                          "/workspace/llm4binary/github/license_c_cmakelists/jeffdaily[P]parasail/contrib/sais-lite-lcp/sais.c"
                          ,0x5d,"void LMSsort1(const void *, int *, int *, int *, int, int, int)");
          }
          uVar11 = uVar31 - 1;
          if (cs == 4) {
            uVar37 = *(uint *)((long)T + (ulong)uVar11 * 4);
          }
          else {
            uVar37 = (uint)*(byte *)((long)T + (ulong)uVar11);
          }
          uVar31 = -uVar31;
          if ((int)uVar36 <= (int)uVar37) {
            uVar31 = uVar11;
          }
          SA[(int)uVar23] = uVar31;
          uVar23 = uVar23 + 1;
          uVar31 = 0;
LAB_0010f098:
          SA[uVar14] = uVar31;
        }
        uVar14 = uVar14 + 1;
      } while (uVar5 != uVar14);
      if (__s == __ptr) {
        uVar14 = 0;
        memset(__s,0,uVar21 * 4);
        do {
          if (cs == 4) {
            uVar36 = *(uint *)((long)T + uVar14 * 4);
          }
          else {
            uVar36 = (uint)*(byte *)((long)T + uVar14);
          }
          __s[(int)uVar36] = __s[(int)uVar36] + 1;
          uVar14 = uVar14 + 1;
        } while (uVar5 != uVar14);
      }
      uVar14 = 0;
      uVar36 = 0;
      do {
        uVar36 = uVar36 + __s[uVar14];
        __ptr[uVar14] = uVar36;
        uVar14 = uVar14 + 1;
      } while (uVar21 != uVar14);
      uVar36 = *__ptr;
      uVar23 = 0;
      uVar14 = uVar19;
      do {
        uVar31 = SA[uVar14];
        lVar39 = (long)(int)uVar31;
        if (0 < lVar39) {
          if (cs == 4) {
            uVar11 = *(uint *)((long)T + lVar39 * 4);
            uVar37 = *(uint *)((long)T + lVar39 * 4 + 4);
          }
          else {
            uVar11 = (uint)*(byte *)((long)T + lVar39);
            uVar37 = (uint)*(byte *)((long)T + lVar39 + 1);
          }
          if ((int)uVar37 < (int)uVar11) {
            __assert_fail("chr(j) <= chr(j + 1)",
                          "/workspace/llm4binary/github/license_c_cmakelists/jeffdaily[P]parasail/contrib/sais-lite-lcp/sais.c"
                          ,0x6b,"void LMSsort1(const void *, int *, int *, int *, int, int, int)");
          }
          if (cs == 4) {
            uVar11 = *(uint *)((long)T + lVar39 * 4);
          }
          else {
            uVar11 = (uint)*(byte *)((long)T + lVar39);
          }
          if (uVar11 != uVar23) {
            __ptr[(int)uVar23] = uVar36;
            uVar36 = __ptr[(int)uVar11];
            uVar23 = uVar11;
          }
          lVar39 = (long)(int)uVar36;
          if ((long)uVar14 < lVar39) {
            __assert_fail("(bb) <= i",
                          "/workspace/llm4binary/github/license_c_cmakelists/jeffdaily[P]parasail/contrib/sais-lite-lcp/sais.c"
                          ,0x6d,"void LMSsort1(const void *, int *, int *, int *, int, int, int)");
          }
          uVar11 = uVar31 - 1;
          if (cs == 4) {
            uVar37 = *(uint *)((long)T + (ulong)uVar11 * 4);
          }
          else {
            uVar37 = (uint)*(byte *)((long)T + (ulong)uVar11);
          }
          uVar31 = ~uVar31;
          if ((int)uVar37 <= (int)uVar23) {
            uVar31 = uVar11;
          }
          uVar36 = uVar36 - 1;
          SA[lVar39 + -1] = uVar31;
          SA[uVar14] = 0;
        }
        bVar40 = 0 < (long)uVar14;
        uVar14 = uVar14 - 1;
      } while (bVar40);
      uVar14 = 1;
      if (1 < n) {
        uVar14 = (ulong)(uint)n;
      }
      uVar29 = 1;
      while (SA[uVar29 - 1] < 0) {
        SA[uVar29 - 1] = ~SA[uVar29 - 1];
        bVar40 = uVar29 == uVar14;
        uVar29 = uVar29 + 1;
        if (bVar40) {
          __assert_fail("(i + 1) < n",
                        "/workspace/llm4binary/github/license_c_cmakelists/jeffdaily[P]parasail/contrib/sais-lite-lcp/sais.c"
                        ,0x7f,"int LMSpostproc1(const void *, int *, int, int, int)");
        }
      }
      uVar14 = uVar29 - 1;
      if ((int)uVar14 < (int)uVar24) {
        if ((int)uVar29 < n) {
          do {
            if (SA[uVar29] < 0) {
              iVar20 = (int)uVar14;
              uVar36 = iVar20 + 1;
              uVar14 = (ulong)uVar36;
              SA[iVar20] = ~SA[uVar29];
              SA[uVar29] = 0;
              if (uVar36 == uVar24) goto LAB_0010f278;
            }
            uVar29 = uVar29 + 1;
          } while (uVar5 != uVar29);
        }
        __assert_fail("i < n",
                      "/workspace/llm4binary/github/license_c_cmakelists/jeffdaily[P]parasail/contrib/sais-lite-lcp/sais.c"
                      ,0x82,"int LMSpostproc1(const void *, int *, int, int, int)");
      }
LAB_0010f278:
      if (cs == 4) {
        uVar36 = *(uint *)((long)T + uVar19 * 4);
      }
      else {
        uVar36 = (uint)*(byte *)((long)T + uVar19);
      }
      uVar29 = uVar18;
      uVar14 = uVar19;
      do {
        uVar14 = uVar14 - 1;
        iVar20 = (int)uVar29;
        if (iVar20 < 1) {
          uVar29 = (ulong)(((int)uVar8 >> 0x1f & uVar8) - 1);
          uVar23 = uVar36;
          break;
        }
        if (cs == 4) {
          uVar23 = *(uint *)((long)T + (uVar14 & 0xffffffff) * 4);
        }
        else {
          uVar23 = (uint)*(byte *)((long)T + (uVar14 & 0xffffffff));
        }
        uVar29 = (ulong)(iVar20 - 1);
        bVar40 = (int)uVar36 <= (int)uVar23;
        uVar36 = uVar23;
      } while (bVar40);
      if (0 < iVar20) {
        do {
          uVar36 = (int)(uint)uVar29 >> 0x1f & (uint)uVar29;
          uVar14 = uVar29;
          do {
            uVar14 = uVar14 - 1;
            uVar37 = (uint)uVar29;
            uVar28 = (ulong)(uVar36 - 1);
            uVar31 = uVar23;
            uVar11 = uVar36;
            if ((int)uVar37 < 1) break;
            if (cs == 4) {
              uVar31 = *(uint *)((long)T + (uVar14 & 0xffffffff) * 4);
            }
            else {
              uVar31 = (uint)*(byte *)((long)T + (uVar14 & 0xffffffff));
            }
            uVar29 = (ulong)(uVar37 - 1);
            bVar40 = (int)uVar31 <= (int)uVar23;
            uVar28 = uVar29;
            uVar11 = uVar37;
            uVar23 = uVar31;
          } while (bVar40);
          uVar29 = 0xffffffff;
          uVar23 = uVar31;
          if (0 < (int)uVar37) {
            SA[(uVar11 >> 1) + uVar24] = (int)uVar18 - (int)uVar28;
            uVar18 = uVar28;
            do {
              uVar18 = uVar18 - 1;
              if ((int)uVar28 < 1) {
                uVar18 = (ulong)uVar11;
                goto LAB_0010f371;
              }
              if (cs == 4) {
                uVar36 = *(uint *)((long)T + (uVar18 & 0xffffffff) * 4);
              }
              else {
                uVar36 = (uint)*(byte *)((long)T + (uVar18 & 0xffffffff));
              }
              uVar28 = (ulong)((int)uVar28 - 1);
              bVar40 = (int)uVar23 <= (int)uVar36;
              uVar23 = uVar36;
            } while (bVar40);
            uVar18 = (ulong)uVar11;
            uVar29 = uVar28;
          }
LAB_0010f371:
        } while (-1 < (int)uVar29);
      }
      local_70 = local_e8;
      uVar14 = 0;
      iVar20 = 0;
      uVar18 = 0;
      iVar9 = n;
      do {
        iVar17 = SA[uVar14];
        iVar32 = (iVar17 >> 1) + uVar24;
        uVar36 = SA[iVar32];
        if ((uVar36 == (uint)uVar18) && ((int)(uVar36 + iVar9) < n)) {
          if ((int)uVar36 < 1) {
            uVar23 = 0;
          }
          else {
            uVar29 = 0;
            do {
              if (cs == 4) {
                uVar23 = *(uint *)((long)T + uVar29 * 4 + (long)iVar17 * 4);
                uVar31 = *(uint *)((long)T + uVar29 * 4 + (long)iVar9 * 4);
              }
              else {
                uVar23 = (uint)*(byte *)((long)T + uVar29 + (long)iVar17);
                uVar31 = (uint)*(byte *)((long)T + uVar29 + (long)iVar9);
              }
              if (uVar23 != uVar31) goto LAB_0010f40d;
              uVar29 = uVar29 + 1;
            } while (uVar36 != uVar29);
            uVar29 = (ulong)uVar36;
LAB_0010f40d:
            uVar23 = (uint)uVar29;
          }
          if (uVar23 != uVar36) goto LAB_0010f43a;
        }
        else {
LAB_0010f43a:
          iVar20 = iVar20 + 1;
          uVar18 = (ulong)uVar36;
          iVar9 = iVar17;
        }
        SA[iVar32] = iVar20;
        uVar14 = uVar14 + 1;
      } while (uVar14 != local_e8);
      goto LAB_0010f451;
    }
    uVar29 = (ulong)(uint)((int)local_60 * 2);
    if ((bVar22 & 0x10) == 0) {
      puVar4 = __ptr + -uVar29;
LAB_0010eab2:
      if (n <= (int)(uVar14 + 1)) {
        __assert_fail("(j + 1) < n",
                      "/workspace/llm4binary/github/license_c_cmakelists/jeffdaily[P]parasail/contrib/sais-lite-lcp/sais.c"
                      ,0x272,
                      "int sais_main(const void *, int *, int *, int, int, int, int, int, int)");
      }
      if (cs == 4) {
        uVar36 = *(uint *)((long)T + uVar14 * 4 + 4);
      }
      else {
        uVar36 = (uint)*(byte *)((long)T + uVar14 + 1);
      }
      __ptr[(int)uVar36] = __ptr[(int)uVar36] + 1;
      if (0 < (int)local_60) {
        uVar14 = 0;
        uVar36 = 0;
        do {
          uVar36 = uVar36 + __s[uVar14];
          uVar23 = __ptr[uVar14];
          if (uVar23 != uVar36) {
            if (SA[(int)uVar23] == 0) {
              __assert_fail("SA[B[i]] != 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/jeffdaily[P]parasail/contrib/sais-lite-lcp/sais.c"
                            ,0x276,
                            "int sais_main(const void *, int *, int *, int, int, int, int, int, int)"
                           );
            }
            SA[(int)uVar23] = SA[(int)uVar23] + n;
          }
          puVar4[uVar21 + uVar14] = 0;
          puVar4[uVar14] = 0;
          uVar14 = uVar14 + 1;
        } while (uVar21 != uVar14);
      }
      if (__s == __ptr) {
        __assert_fail("C != B",
                      "/workspace/llm4binary/github/license_c_cmakelists/jeffdaily[P]parasail/contrib/sais-lite-lcp/sais.c"
                      ,0xa9,"void LMSsort2(const void *, int *, int *, int *, int *, int, int, int)"
                     );
      }
      uVar14 = 0;
      uVar36 = 0;
      do {
        uVar23 = __s[uVar14];
        __ptr[uVar14] = uVar36;
        uVar14 = uVar14 + 1;
        uVar36 = uVar23 + uVar36;
      } while (uVar21 != uVar14);
      if (cs == 4) {
        uVar36 = *(uint *)((long)T + uVar19 * 4);
      }
      else {
        uVar36 = (uint)*(byte *)((long)T + uVar19);
      }
      uVar31 = n - 2;
      uVar23 = __ptr[(int)uVar36];
      if (cs == 4) {
        uVar11 = *(uint *)((long)T + (ulong)uVar31 * 4);
      }
      else {
        uVar11 = (uint)*(byte *)((long)T + (ulong)uVar31);
      }
      SA[(int)uVar23] = -(uint)((int)uVar11 < (int)uVar36) ^ uVar31 + n;
      puVar25 = (uint *)(SA + (int)uVar23 + 1);
      uVar14 = 0;
      uVar23 = 0;
      do {
        uVar31 = SA[uVar14];
        if ((int)uVar31 < 1) {
          if ((int)uVar31 < 0) {
            uVar31 = ~uVar31;
            goto LAB_0010ecc7;
          }
        }
        else {
          iVar20 = 0;
          if (n <= (int)uVar31) {
            iVar20 = n;
          }
          lVar39 = (long)(int)(uVar31 - iVar20);
          if (cs == 4) {
            uVar11 = *(uint *)((long)T + lVar39 * 4);
            uVar37 = *(uint *)((long)T + lVar39 * 4 + 4);
          }
          else {
            uVar11 = (uint)*(byte *)((long)T + lVar39);
            uVar37 = (uint)*(byte *)((long)T + lVar39 + 1);
          }
          if ((int)uVar11 < (int)uVar37) {
            __assert_fail("chr(j) >= chr(j + 1)",
                          "/workspace/llm4binary/github/license_c_cmakelists/jeffdaily[P]parasail/contrib/sais-lite-lcp/sais.c"
                          ,0xb6,
                          "void LMSsort2(const void *, int *, int *, int *, int *, int, int, int)");
          }
          if (cs == 4) {
            uVar11 = *(uint *)((long)T + lVar39 * 4);
          }
          else {
            uVar11 = (uint)*(byte *)((long)T + lVar39);
          }
          if (uVar11 != uVar36) {
            __ptr[(int)uVar36] = (uint)((ulong)((long)puVar25 - (long)SA) >> 2);
            puVar25 = (uint *)(SA + (int)__ptr[(int)uVar11]);
            uVar36 = uVar11;
          }
          if ((long)puVar25 - (long)SA >> 2 <= (long)uVar14) {
            __assert_fail("i < (b - SA)",
                          "/workspace/llm4binary/github/license_c_cmakelists/jeffdaily[P]parasail/contrib/sais-lite-lcp/sais.c"
                          ,0xb8,
                          "void LMSsort2(const void *, int *, int *, int *, int *, int, int, int)");
          }
          uVar29 = lVar39 - 1;
          if (cs == 4) {
            uVar37 = *(uint *)((long)T + lVar39 * 4 + -4);
          }
          else {
            uVar37 = (uint)*(byte *)((long)T + uVar29);
          }
          uVar23 = uVar23 + (n <= (int)uVar31);
          uVar31 = (uint)((int)uVar37 < (int)uVar36) | uVar11 * 2;
          if (puVar4[(int)uVar31] != uVar23) {
            uVar29 = (ulong)(uint)((int)uVar29 + n);
            puVar4[(int)uVar31] = uVar23;
          }
          *puVar25 = -(uint)((int)uVar37 < (int)uVar36) ^ (uint)uVar29;
          puVar25 = puVar25 + 1;
          uVar31 = 0;
LAB_0010ecc7:
          SA[uVar14] = uVar31;
        }
        uVar14 = uVar14 + 1;
      } while (uVar5 != uVar14);
      do {
        uVar36 = (uint)uVar18;
        iVar20 = SA[uVar18];
        if (iVar20 < n && 0 < iVar20) {
          SA[uVar18] = iVar20 + n;
          piVar7 = SA + (int)uVar36;
          do {
            piVar16 = piVar7 + -1;
            piVar7 = piVar7 + -1;
            uVar36 = (int)uVar18 - 1;
            uVar18 = (ulong)uVar36;
          } while (*piVar16 < n);
          *piVar7 = *piVar16 - n;
        }
        uVar18 = (ulong)(uVar36 - 1);
      } while (0 < (int)uVar36);
      uVar18 = 0;
      uVar36 = 0;
      do {
        uVar36 = uVar36 + __s[uVar18];
        __ptr[uVar18] = uVar36;
        uVar18 = uVar18 + 1;
      } while (uVar21 != uVar18);
      uVar23 = uVar23 + 1;
      piVar7 = SA + (int)*__ptr;
      uVar36 = 0;
      uVar18 = uVar19;
      do {
        iVar20 = SA[uVar18];
        if (0 < iVar20) {
          iVar9 = 0;
          if (n <= iVar20) {
            iVar9 = n;
          }
          lVar39 = (long)(iVar20 - iVar9);
          if (cs == 4) {
            uVar31 = *(uint *)((long)T + lVar39 * 4);
            uVar11 = *(uint *)((long)T + lVar39 * 4 + 4);
          }
          else {
            uVar31 = (uint)*(byte *)((long)T + lVar39);
            uVar11 = (uint)*(byte *)((long)T + lVar39 + 1);
          }
          if ((int)uVar11 < (int)uVar31) {
            __assert_fail("chr(j) <= chr(j + 1)",
                          "/workspace/llm4binary/github/license_c_cmakelists/jeffdaily[P]parasail/contrib/sais-lite-lcp/sais.c"
                          ,0xd2,
                          "void LMSsort2(const void *, int *, int *, int *, int *, int, int, int)");
          }
          if (cs == 4) {
            uVar31 = *(uint *)((long)T + lVar39 * 4);
          }
          else {
            uVar31 = (uint)*(byte *)((long)T + lVar39);
          }
          if (uVar31 != uVar36) {
            __ptr[(int)uVar36] = (uint)((ulong)((long)piVar7 - (long)SA) >> 2);
            piVar7 = SA + (int)__ptr[(int)uVar31];
            uVar36 = uVar31;
          }
          if ((long)uVar18 < (long)piVar7 - (long)SA >> 2) {
            __assert_fail("(b - SA) <= i",
                          "/workspace/llm4binary/github/license_c_cmakelists/jeffdaily[P]parasail/contrib/sais-lite-lcp/sais.c"
                          ,0xd4,
                          "void LMSsort2(const void *, int *, int *, int *, int *, int, int, int)");
          }
          uVar14 = lVar39 - 1;
          if (cs == 4) {
            uVar11 = *(uint *)((long)T + lVar39 * 4 + -4);
          }
          else {
            uVar11 = (uint)*(byte *)((long)T + uVar14);
          }
          uVar23 = uVar23 + (n <= iVar20);
          uVar31 = (uint)((int)uVar36 < (int)uVar11) | uVar31 * 2;
          if (puVar4[(int)uVar31] != uVar23) {
            uVar14 = (ulong)(uint)((int)uVar14 + n);
            puVar4[(int)uVar31] = uVar23;
          }
          iVar20 = -2 - (int)uVar14;
          if ((int)uVar11 <= (int)uVar36) {
            iVar20 = (int)uVar14;
          }
          piVar7[-1] = iVar20;
          piVar7 = piVar7 + -1;
          SA[uVar18] = 0;
        }
        bVar40 = 0 < (long)uVar18;
        uVar18 = uVar18 - 1;
      } while (bVar40);
      uVar18 = 1;
      if (1 < n) {
        uVar18 = (ulong)(uint)n;
      }
      iVar20 = 0;
      uVar14 = 1;
      while (SA[uVar14 - 1] < 0) {
        uVar36 = ~SA[uVar14 - 1];
        iVar20 = iVar20 + (uint)(n <= (int)uVar36);
        SA[uVar14 - 1] = uVar36;
        bVar40 = uVar14 == uVar18;
        uVar14 = uVar14 + 1;
        if (bVar40) {
          __assert_fail("(i + 1) < n",
                        "/workspace/llm4binary/github/license_c_cmakelists/jeffdaily[P]parasail/contrib/sais-lite-lcp/sais.c"
                        ,0xe8,"int LMSpostproc2(int *, int, int)");
        }
      }
      uVar18 = uVar14 - 1;
      if ((int)uVar18 < (int)uVar24) {
        if ((int)uVar14 < n) {
          do {
            if (SA[uVar14] < 0) {
              uVar23 = ~SA[uVar14];
              iVar20 = iVar20 + (uint)(n <= (int)uVar23);
              iVar9 = (int)uVar18;
              uVar36 = iVar9 + 1;
              uVar18 = (ulong)uVar36;
              SA[iVar9] = uVar23;
              SA[uVar14] = 0;
              if (uVar36 == uVar24) goto LAB_0010ef48;
            }
            uVar14 = uVar14 + 1;
          } while (uVar5 != uVar14);
        }
        __assert_fail("i < n",
                      "/workspace/llm4binary/github/license_c_cmakelists/jeffdaily[P]parasail/contrib/sais-lite-lcp/sais.c"
                      ,0xec,"int LMSpostproc2(int *, int, int)");
      }
LAB_0010ef48:
      if (iVar20 < (int)uVar24) {
        iVar9 = iVar20 + 1;
        lVar39 = local_e8 + 1;
        do {
          iVar17 = SA[lVar39 + -2];
          iVar32 = 0;
          if (n <= iVar17) {
            iVar32 = n;
          }
          iVar9 = iVar9 - (uint)(n <= iVar17);
          SA[(int)((iVar17 - iVar32 >> 1) + uVar24)] = iVar9;
          lVar39 = lVar39 + -1;
        } while (1 < lVar39);
      }
      else {
        uVar18 = 0;
        do {
          if (n <= SA[uVar18]) {
            SA[uVar18] = SA[uVar18] - n;
          }
          uVar18 = uVar18 + 1;
        } while (local_e8 != uVar18);
      }
      if ((bVar22 & 0x10) != 0) {
        free(puVar4);
      }
      goto LAB_0010f451;
    }
    puVar4 = (uint *)malloc(uVar29 * 4);
    if (puVar4 != (uint *)0x0) goto LAB_0010eab2;
    if ((bVar22 & 5) != 0) {
      free(__s);
    }
    iVar20 = -2;
LAB_00110d5a:
    bVar22 = bVar22 & 2;
    __s = __ptr;
  }
  if (bVar22 == 0) {
    return iVar20;
  }
LAB_00110d61:
  free(__s);
  return iVar20;
}

Assistant:

static sais_index_type sais_main(const void *T, sais_index_type *SA,
				 sais_index_type *LCP,
				 sais_index_type fs, sais_index_type n, sais_index_type k, int cs,
				 sais_bool_type isbwt,
				 sais_bool_type level0) { /* level0 = 1 iff recursion depth is 0 */
  sais_index_type *C, *B, *D, *RA, *PLCP, *PHI, *DELTA, *b;
  sais_index_type i, j, m, /* m: number of S*-suffixes */
    p, q, t, name, pidx = 0, newfs;
  sais_index_type c0, c1;
  unsigned int flags;

  assert((T != NULL) && (SA != NULL));
  assert((0 <= fs) && (0 < n) && (1 <= k));

  if(k <= MINBUCKETSIZE) {
    if((C = SAIS_MYMALLOC(k, sais_index_type)) == NULL) { return -2; }
    if(k <= fs) {
      B = SA + (n + fs - k);
      flags = 1;
    } else {
      if((B = SAIS_MYMALLOC(k, sais_index_type)) == NULL) { SAIS_MYFREE(C, k, sais_index_type); return -2; }
      flags = 3;
    }
  } else if(k <= fs) {
    C = SA + (n + fs - k);
    if(k <= (fs - k)) {
      B = C - k;
      flags = 0;
    } else if(k <= (MINBUCKETSIZE * 4)) {
      if((B = SAIS_MYMALLOC(k, sais_index_type)) == NULL) { return -2; }
      flags = 2;
    } else {
      B = C;
      flags = 8;
    }
  } else {
    if((C = B = SAIS_MYMALLOC(k, sais_index_type)) == NULL) { return -2; }
    flags = 4 | 8;
  }
  if((n <= SAIS_LMSSORT2_LIMIT) && (2 <= (n / k))) {
    if(flags & 1) { flags |= ((k * 2) <= (fs - k)) ? 32 : 16; }
    else if((flags == 0) && ((k * 2) <= (fs - k * 2))) { flags |= 32; }
  }

  /* stage 1: reduce the problem by at least 1/2
     sort all the LMS-substrings */
  getCounts(T, C, n, k, cs); getBuckets(C, B, k, 1); /* find ends of buckets */

  for(i = 0; i < n; ++i) { SA[i] = 0; }
  b = &t; i = n - 1; j = n; m = 0; c0 = chr(n - 1);
  do { c1 = c0; } while((0 <= --i) && ((c0 = chr(i)) >= c1));
  for(; 0 <= i;) {
    do { c1 = c0; } while((0 <= --i) && ((c0 = chr(i)) <= c1));
    if(0 <= i) {
      *b = j;
      b = SA + --B[c1]; j = i; ++m;
      do { c1 = c0; } while((0 <= --i) && ((c0 = chr(i)) >= c1));
    }
  }

  if(1 < m) {
    if(flags & (16 | 32)) {
      if(flags & 16) {
        if((D = SAIS_MYMALLOC(k * 2, sais_index_type)) == NULL) {
          if(flags & (1 | 4)) { SAIS_MYFREE(C, k, sais_index_type); }
          if(flags & 2) { SAIS_MYFREE(B, k, sais_index_type); }
          return -2;
        }
      } else {
        D = B - k * 2;
      }
      assert((j + 1) < n);
      ++B[chr(j + 1)];
      for(i = 0, j = 0; i < k; ++i) {
        j += C[i];
        if(B[i] != j) { assert(SA[B[i]] != 0); SA[B[i]] += n; }
        D[i] = D[i + k] = 0;
      }
      LMSsort2(T, SA, C, B, D, n, k, cs);
      name = LMSpostproc2(SA, n, m);
      if(flags & 16) { SAIS_MYFREE(D, k * 2, sais_index_type); }
    } else {
      LMSsort1(T, SA, C, B, n, k, cs);
      name = LMSpostproc1(T, SA, n, m, cs);
    }
  } else if (m == 1) { /* only one S*-suffix => set immediately */
    *b = j + 1;        /* set entry in SA */
    if (level0) { LCP[b-SA] = -1; } /* mark first (=only) S*-suffix in bucket */
    name = 1;
  } else {
    name = 0;
  }

  /* stage 2: solve the reduced problem
     recurse if names are not yet unique */
  if(name < m) {
    if(flags & 4) { SAIS_MYFREE(C, k, sais_index_type); }
    if(flags & 2) { SAIS_MYFREE(B, k, sais_index_type); }
    newfs = (n + fs) - (m * 2);
    if((flags & (1 | 4 | 8)) == 0) {
      if((k + name) <= newfs) { newfs -= k; }
      else { flags |= 8; }
    }
    assert((n >> 1) <= (newfs + m));
    RA = SA + m + newfs;
    for(i = m + (n >> 1) - 1, j = m - 1; m <= i; --i) {
      if(SA[i] != 0) {
        RA[j--] = SA[i] - 1;
      }
    }
    
    if(sais_main(RA, SA, NULL, newfs, m, name, sizeof(sais_index_type), 0, 0) != 0) {
      if(flags & 1) { SAIS_MYFREE(C, k, sais_index_type); }
      return -2;
    }

    /* (re)compute starting positions of S*-suffixes (stored in RA): */
    i = n - 1; j = m - 1; c0 = chr(n - 1);
    do { c1 = c0; } while((0 <= --i) && ((c0 = chr(i)) >= c1));
    for(; 0 <= i;) {
      do { c1 = c0; } while((0 <= --i) && ((c0 = chr(i)) <= c1));
      if(0 <= i) {
        RA[j--] = i + 1;
        do { c1 = c0; } while((0 <= --i) && ((c0 = chr(i)) >= c1));
      }
    }

    /* construct LCP for S*-suffixes: */
    /* PHI: "to whom I want to be compared" (pos. in T) */
    /* DELTA: "distance (in T) to next S*" (in PHI-order) */
    if (level0) {
      if (m < n/3) { /* hence we can store PHI and DELTA interleaved */
	PHI = LCP+m;       /* use space in LCP-array for PHI and DELTA */
	RA[m] = n;         /* stopper */
	j = SA[0];         /* j stores SA[i-1] in the following loop */
	PHI[j<<1] = n-1;   /* set PHI[SA[0]] to $ (causes mismatch in char. comp.) */
	PHI[(j<<1)+1] = 0; /* set DELTA */
	for (i = 1; i < m; ++i) {
	  q = SA[i];                /* text position */
	  p = q<<1;                 /* for interleaving */
	  PHI[p]=RA[j];             /* set PHI-array */
	  PHI[p+1]=RA[j+1]-RA[j];   /* set DELTA */
	  j = q;                    /* store for next loop iteration */
	}

	PLCP = PHI; /* overwrite DELTA in following loop */
	p = 0; /* guaranteed LCP-value */
	j = 0; /* position in PLCP and RA */
	for (i = 0; i < n; ++i) {
	  if (i == RA[j]) {
	    sais_index_type twoj = j << 1;
	    if (p < 0) p = 0;
	    while (chr(i+p) == chr(PHI[twoj]+p)) ++p;
	    t = PHI[twoj+1];      /* accesses DELTA-value */
	    q = RA[j+1]-RA[j];    /* length difference */
	    PLCP[twoj] = p;       /* overwrite PHI with PLCP */
	    ++j;
	    p -= (t > q) ? t : q; /* decrease p by larger of t and q */
	  }
	}

	/* translate PLCP-values to SA-order: */
	for (j = 0; j < m; ++j) LCP[j] = PLCP[SA[j]<<1];
      }
      else { /* non-interleaved */
	PHI = LCP;     /* use space in LCP-array for PHI */
	DELTA = LCP+m; /* because we compute only m < n/2 values, this is valid */
	RA[m] = n;     /* stopper */
	j = SA[0];     /* j stores SA[i-1] in the following loop */
	PHI[j] = n-1;  /* set PHI[SA[0]] to $ (causes mismatch in char. comp.) */
	DELTA[j] = 0;
	for (i = 1; i < m; ++i) {
	  q = SA[i];              /* text position */
	  PHI[q]=RA[j];           /* set PHI-array */
	  DELTA[q]=RA[j+1]-RA[j]; /* set DELTA */
	  j = q;                  /* store for next loop iteration */
	}

	PLCP = DELTA; /* overwrite DELTA in following loop */
	p = 0; /* guaranteed LCP-value */
	j = 0; /* position in PLCP and RA */
	for (i = 0; i < n; ++i) {
	  if (i == RA[j]) {
	    if (p < 0) p = 0;
	    while (chr(i+p) == chr(PHI[j]+p)) ++p;
	    t = PLCP[j];          /* accesses DELTA-value */
	    q = RA[j+1]-RA[j];    /* length difference */
	    PLCP[j++] = p;
	    p -= (t > q) ? t : q; /* decrease p by larger of t and q */
	  }
	}

	/* translate PLCP-values to SA-order: */
	for (j = 0; j < m; ++j) LCP[j] = PLCP[SA[j]];
      }
    }

    /* translate indices in RA to indices in T: */
    for(i = 0; i < m; ++i) SA[i] = RA[SA[i]];

    if(flags & 4) {
      if((C = B = SAIS_MYMALLOC(k, int)) == NULL) { return -2; }
    }
    if(flags & 2) {
      if((B = SAIS_MYMALLOC(k, int)) == NULL) {
        if(flags & 1) { SAIS_MYFREE(C, k, sais_index_type); }
        return -2;
      }
    }
  } /* endif (name < m) */
  else if (level0) { /* this should only occur for small or pathetic inputs */
    /* all names unique => computing LCP for *S naively takes linear time */
    /*printf("*** computing LCP naively..."); */
    j = SA[0]; /* j = SA[i-1] in the following loop */
    for (i = 1; i < m; ++i) {
      p = 0;
      while (chr(SA[i]+p) == chr(j+p)) p++;
      LCP[i] = p;
      j = SA[i];
    }
    /*printf("done.\n"); */
  }

  /* stage 3: induce the result for the original problem */
  if(flags & 8) { getCounts(T, C, n, k, cs); }
  /* put all S*-suffixes (and their LCP-values) into their buckets */
  if(1 < m) { /* otherwise SA (and LCP) is already correct */
    getBuckets(C, B, k, 1); /* find ends of buckets */
    i = m - 1, j = n, p = SA[m - 1], c1 = chr(p);
    if (level0) {
      newfs = LCP[m-1]; /* newfs stores LCP[i] in the following loop */
      do {
	q = B[c0 = c1];
	while(q < j) {
	  SA[--j] = 0; LCP[j] = -2; /* set remaining entries in old bucket to 0/-2 */
	}
	
	do { /* step through bucket c0 and write S*-suffixes to SA: */
	  SA[--j] = p; LCP[j] = newfs;
	  if(--i < 0) break;
	  newfs = LCP[i]; p = SA[i];
	} while((c1 = chr(p)) == c0);
	/*assert(LCP[j]==0); *//* first S*-suffix in bucket must have LCP-value 0 */
	LCP[j] = -1;       /* mark first S*-suffix in every bucket */
      } while(0 <= i);
      while(0 < j) {
	SA[--j] = 0; LCP[j] = -2; /* set remaining entries in smallest buckets to 0/-2 */
      }
    }
    else {
      do {
	q = B[c0 = c1];
	while(q < j) SA[--j] = 0; /* set remaining entries in old bucket to 0 */
	do { /* step through bucket c0 */
	  SA[--j] = p;
	  if(--i < 0) break;
	  p = SA[i];
	} while((c1 = chr(p)) == c0);
      } while(0 <= i);
      while(0 < j) SA[--j] = 0; /* set remaining entries in 1st bucket to 0 */
    }
  }

  if(isbwt == 0) {
    if (level0) induceSAandLCP(T, SA, LCP, C, B, n, k, cs);
    else induceSA(T, SA, C, B, n, k, cs);
  }
  else { pidx = computeBWT(T, SA, C, B, n, k, cs); }
  if(flags & (1 | 4)) { SAIS_MYFREE(C, k, sais_index_type); }
  if(flags & 2) { SAIS_MYFREE(B, k, sais_index_type); }

  return pidx;
}